

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

vector<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
* llava_uhd::slice_image
            (vector<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
             *__return_storage_ptr__,clip_image_u8 *img,slice_instructions *inst)

{
  int x;
  int y;
  int w;
  int h;
  pointer psVar1;
  clip_image_u8 *dst;
  pointer psVar2;
  _Head_base<0UL,_clip_image_u8_*,_false> local_40;
  __uniq_ptr_impl<clip_image_u8,_clip_image_u8_deleter> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>,_std::allocator<std::unique_ptr<clip_image_u8,_clip_image_u8_deleter>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_t.super__Tuple_impl<0UL,_clip_image_u8_*,_clip_image_u8_deleter>.
  super__Head_base<0UL,_clip_image_u8_*,_false>._M_head_impl =
       (tuple<clip_image_u8_*,_clip_image_u8_deleter>)operator_new(0x20);
  *(pointer *)
   ((long)local_38._M_t.super__Tuple_impl<0UL,_clip_image_u8_*,_clip_image_u8_deleter>.
          super__Head_base<0UL,_clip_image_u8_*,_false>._M_head_impl + 0x10) = (pointer)0x0;
  *(pointer *)
   ((long)local_38._M_t.super__Tuple_impl<0UL,_clip_image_u8_*,_clip_image_u8_deleter>.
          super__Head_base<0UL,_clip_image_u8_*,_false>._M_head_impl + 0x18) = (pointer)0x0;
  *(undefined8 *)
   local_38._M_t.super__Tuple_impl<0UL,_clip_image_u8_*,_clip_image_u8_deleter>.
   super__Head_base<0UL,_clip_image_u8_*,_false>._M_head_impl = 0;
  (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
   ((long)local_38._M_t.super__Tuple_impl<0UL,_clip_image_u8_*,_clip_image_u8_deleter>.
          super__Head_base<0UL,_clip_image_u8_*,_false>._M_head_impl + 8))->
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  image_manipulation::bicubic_resize
            (img,(clip_image_u8 *)
                 local_38._M_t.super__Tuple_impl<0UL,_clip_image_u8_*,_clip_image_u8_deleter>.
                 super__Head_base<0UL,_clip_image_u8_*,_false>._M_head_impl,
             (inst->overview_size).width,(inst->overview_size).height);
  std::
  vector<std::unique_ptr<clip_image_u8,clip_image_u8_deleter>,std::allocator<std::unique_ptr<clip_image_u8,clip_image_u8_deleter>>>
  ::emplace_back<std::unique_ptr<clip_image_u8,clip_image_u8_deleter>>
            ((vector<std::unique_ptr<clip_image_u8,clip_image_u8_deleter>,std::allocator<std::unique_ptr<clip_image_u8,clip_image_u8_deleter>>>
              *)__return_storage_ptr__,(unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)&local_38
            );
  if ((inst->slices).
      super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (inst->slices).
      super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    dst = (clip_image_u8 *)operator_new(0x20);
    (dst->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (dst->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dst->nx = 0;
    dst->ny = 0;
    (dst->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (inst->padding_refined == true) {
      image_manipulation::resize_and_pad_image
                (img,dst,&inst->refined_size,(array<unsigned_char,_3UL>)0x0);
    }
    else {
      image_manipulation::bilinear_resize
                (img,dst,(inst->refined_size).width,(inst->refined_size).height);
    }
    psVar1 = (inst->slices).
             super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar2 = (inst->slices).
                  super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1)
    {
      x = psVar2->x;
      y = psVar2->y;
      w = (psVar2->size).width;
      h = (psVar2->size).height;
      local_40._M_head_impl = (clip_image_u8 *)operator_new(0x20);
      ((local_40._M_head_impl)->buf).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ((local_40._M_head_impl)->buf).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_40._M_head_impl)->nx = 0;
      (local_40._M_head_impl)->ny = 0;
      ((local_40._M_head_impl)->buf).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      image_manipulation::crop_image(dst,local_40._M_head_impl,x,y,w,h);
      std::
      vector<std::unique_ptr<clip_image_u8,clip_image_u8_deleter>,std::allocator<std::unique_ptr<clip_image_u8,clip_image_u8_deleter>>>
      ::emplace_back<std::unique_ptr<clip_image_u8,clip_image_u8_deleter>>
                ((vector<std::unique_ptr<clip_image_u8,clip_image_u8_deleter>,std::allocator<std::unique_ptr<clip_image_u8,clip_image_u8_deleter>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<clip_image_u8,_clip_image_u8_deleter> *)&local_40);
      if (local_40._M_head_impl != (clip_image_u8 *)0x0) {
        clip_image_u8_free(local_40._M_head_impl);
      }
    }
    clip_image_u8_free(dst);
  }
  if (local_38._M_t.super__Tuple_impl<0UL,_clip_image_u8_*,_clip_image_u8_deleter>.
      super__Head_base<0UL,_clip_image_u8_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_clip_image_u8_*,_clip_image_u8_deleter>)0x0) {
    clip_image_u8_free((clip_image_u8 *)
                       local_38._M_t.super__Tuple_impl<0UL,_clip_image_u8_*,_clip_image_u8_deleter>.
                       super__Head_base<0UL,_clip_image_u8_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<clip_image_u8_ptr> slice_image(const clip_image_u8 * img, const slice_instructions & inst) {
        std::vector<clip_image_u8_ptr> output;

        // resize to overview size
        clip_image_u8_ptr resized_img(clip_image_u8_init());
        image_manipulation::bicubic_resize(*img, *resized_img, inst.overview_size.width, inst.overview_size.height);
        output.push_back(std::move(resized_img));
        if (inst.slices.empty()) {
            // no slices, just return the resized image
            return output;
        }

        // resize to refined size
        clip_image_u8_ptr refined_img(clip_image_u8_init());
        if (inst.padding_refined) {
            image_manipulation::resize_and_pad_image(*img, *refined_img, inst.refined_size);
        } else {
            image_manipulation::bilinear_resize(*img, *refined_img, inst.refined_size.width, inst.refined_size.height);
        }

        // create slices
        for (const auto & slice : inst.slices) {
            int x = slice.x;
            int y = slice.y;
            int w = slice.size.width;
            int h = slice.size.height;

            clip_image_u8_ptr img_slice(clip_image_u8_init());
            image_manipulation::crop_image(*refined_img, *img_slice, x, y, w, h);
            output.push_back(std::move(img_slice));
        }

        return output;
    }